

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::loadMatrixVecs(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this)

{
  Verbosity VVar1;
  int n;
  int iVar2;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  **ppSVar4;
  long in_RDI;
  int i;
  Verbosity old_verbosity;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  SPxOut *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  Verbosity in_stack_fffffffffffffff4;
  
  if ((*(long *)(in_RDI + 0x368) != 0) &&
     (VVar1 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x368)), 4 < (int)VVar1)) {
    in_stack_fffffffffffffff4 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x368));
    in_stack_fffffffffffffff0 = 5;
    (**(code **)(**(long **)(in_RDI + 0x368) + 0x10))
              (*(long **)(in_RDI + 0x368),&stack0xfffffffffffffff0);
    soplex::operator<<(in_stack_ffffffffffffffd0,
                       (char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    soplex::operator<<(in_stack_ffffffffffffffd0,
                       (_func_ostream_ptr_ostream_ptr *)
                       CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    (**(code **)(**(long **)(in_RDI + 0x368) + 0x10))
              (*(long **)(in_RDI + 0x368),&stack0xfffffffffffffff4);
  }
  *(undefined4 *)(in_RDI + 0x1ec) = 0;
  n = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::dim((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x6a4f6b);
  while (n = n + -1, -1 < n) {
    baseId(*(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             **)(in_RDI + 8),in_stack_ffffffffffffffcc);
    pSVar3 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ::vector((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
                      (SPxId *)CONCAT44(n,in_stack_ffffffffffffffe8));
    ppSVar4 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
              ::operator[]((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                            *)(in_RDI + 0x28),n);
    *ppSVar4 = pSVar3;
    ppSVar4 = DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
              ::operator[]((DataArray<const_soplex::SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_*>
                            *)(in_RDI + 0x28),n);
    iVar2 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::size(*ppSVar4);
    *(int *)(in_RDI + 0x1ec) = iVar2 + *(int *)(in_RDI + 0x1ec);
  }
  *(undefined1 *)(in_RDI + 0x40) = 1;
  *(undefined1 *)(in_RDI + 0x50) = 0;
  if (*(long *)(in_RDI + 0x48) != 0) {
    (**(code **)(**(long **)(in_RDI + 0x48) + 0x10))();
  }
  return;
}

Assistant:

void SPxBasisBase<R>::loadMatrixVecs()
{
   assert(theLP != nullptr);
   assert(theLP->dim() == matrix.size());

   SPX_MSG_INFO3((*this->spxout),
                 (*this->spxout) << "IBASIS01 loadMatrixVecs() invalidates factorization"
                 << std::endl;)

   int i;
   nzCount = 0;

   for(i = theLP->dim() - 1; i >= 0; --i)
   {
      matrix[i] = &theLP->vector(baseId(i));
      nzCount += matrix[i]->size();
   }

   matrixIsSetup = true;
   factorized = false;

   if(factor != nullptr)
      factor->clear();
}